

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_spike.cpp
# Opt level: O1

int AF_A_ThrustImpale(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double dVar1;
  VM_UBYTE VVar2;
  AActor *origin;
  undefined8 *puVar3;
  double dVar4;
  PClass *pPVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined8 uVar7;
  PClass *pPVar8;
  char *__assertion;
  bool bVar9;
  CheckResult cres;
  FPortalGroupArray check;
  FMultiBlockThingsIterator it;
  FName local_22c;
  DAngle local_228;
  CheckResult local_220;
  FPortalGroupArray local_1f8;
  FMultiBlockThingsIterator local_1d0;
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005c2abc;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    origin = (AActor *)(param->field_0).field_1.a;
    if (origin != (AActor *)0x0) {
      if ((origin->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar6 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
        (origin->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar6);
      }
      pPVar8 = (origin->super_DThinker).super_DObject.Class;
      bVar9 = pPVar8 != (PClass *)0x0;
      if (pPVar8 != pPVar5 && bVar9) {
        do {
          pPVar8 = pPVar8->ParentClass;
          bVar9 = pPVar8 != (PClass *)0x0;
          if (pPVar8 == pPVar5) break;
        } while (pPVar8 != (PClass *)0x0);
      }
      if (!bVar9) {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005c2abc;
      }
    }
    pPVar5 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar2 = param[1].field_0.field_3.Type, VVar2 != 0xff)) {
      if ((VVar2 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005c2a91;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar7 = (**(code **)*puVar3)(puVar3);
          puVar3[1] = uVar7;
        }
        pPVar8 = (PClass *)puVar3[1];
        bVar9 = pPVar8 != (PClass *)0x0;
        if (pPVar8 != pPVar5 && bVar9) {
          do {
            pPVar8 = pPVar8->ParentClass;
            bVar9 = pPVar8 != (PClass *)0x0;
            if (pPVar8 == pPVar5) break;
          } while (pPVar8 != (PClass *)0x0);
        }
        if (!bVar9) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005c2abc;
        }
      }
    }
    if (((numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
       ((VVar2 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      local_1f8.data.Array = (unsigned_short *)0x0;
      local_1f8.data.Most = 0;
      local_1f8.data.Count = 0;
      local_1f8.method = 1;
      local_1f8.varused = '\0';
      local_1f8.inited = false;
      FMultiBlockThingsIterator::FMultiBlockThingsIterator(&local_1d0,&local_1f8,origin,-1.0,false);
      while( true ) {
        bVar9 = FMultiBlockThingsIterator::Next(&local_1d0,&local_220);
        if (!bVar9) break;
        dVar4 = origin->radius + (local_220.thing)->radius;
        if ((ABS(((local_220.thing)->__Pos).X - local_220.Position.X) < dVar4) &&
           (ABS(((local_220.thing)->__Pos).Y - local_220.Position.Y) < dVar4)) {
          dVar4 = ((local_220.thing)->__Pos).Z;
          dVar1 = (origin->__Pos).Z;
          if ((((dVar1 <= (local_220.thing)->Height + dVar4) && (dVar4 <= dVar1 + origin->Height))
              || (origin->Sector->PortalGroup == (local_220.thing)->Sector->PortalGroup)) &&
             ((local_220.thing != origin && ((((local_220.thing)->flags).Value & 4) != 0)))) {
            local_22c.Index = 0x8b;
            local_228.Degrees = 0.0;
            iVar6 = P_DamageMobj(local_220.thing,origin,origin,0x2711,&local_22c,0,&local_228);
            if (iVar6 < 1) {
              iVar6 = 0x2711;
            }
            P_TraceBleed(iVar6,local_220.thing);
            origin->args[1] = 1;
          }
        }
      }
      TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry>::~TArray
                (&local_1d0.blockIterator.DynHash);
      TArray<unsigned_short,_unsigned_short>::~TArray(&local_1f8.data);
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005c2a91:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005c2abc:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_spike.cpp"
                ,0x9a,"int AF_A_ThrustImpale(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ThrustImpale)
{
	PARAM_ACTION_PROLOGUE;

	// This doesn't need to iterate through portals.

	FPortalGroupArray check;
	FMultiBlockThingsIterator it(check, self);
	FMultiBlockThingsIterator::CheckResult cres;
	while (it.Next(&cres))
	{
		double blockdist = self->radius + cres.thing->radius;
		if (fabs(cres.thing->X() - cres.Position.X) >= blockdist || fabs(cres.thing->Y() - cres.Position.Y) >= blockdist)
			continue;

		// Q: Make this z-aware for everything? It never was before.
		if (cres.thing->Top() < self->Z() || cres.thing->Z() > self->Top())
		{
			if (self->Sector->PortalGroup != cres.thing->Sector->PortalGroup)
				continue;
		}

		if (!(cres.thing->flags & MF_SHOOTABLE) )
			continue;

		if (cres.thing == self)
			continue;	// don't clip against self

		int newdam = P_DamageMobj (cres.thing, self, self, 10001, NAME_Crush);
		P_TraceBleed (newdam > 0 ? newdam : 10001, cres.thing);
		self->args[1] = 1;	// Mark thrust thing as bloody
	}
	return 0;
}